

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O3

DdNode * cuddBddTransfer(DdManager *ddS,DdManager *ddD,DdNode *f)

{
  int *piVar1;
  int iVar2;
  st__table *table;
  DdNode *pDVar3;
  st__generator *gen;
  DdNode *value;
  DdNode *key;
  DdNode *local_40;
  char *local_38;
  
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table != (st__table *)0x0) {
    pDVar3 = cuddBddTransferRecur(ddS,ddD,f,table);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
    }
    gen = st__init_gen(table);
    if (gen == (st__generator *)0x0) {
      st__free_table(table);
    }
    else {
      iVar2 = st__gen(gen,&local_38,(char **)&local_40);
      if (iVar2 != 0) {
        do {
          Cudd_RecursiveDeref(ddD,local_40);
          iVar2 = st__gen(gen,&local_38,(char **)&local_40);
        } while (iVar2 != 0);
      }
      st__free_gen(gen);
      st__free_table(table);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar3;
      }
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddTransfer(
  DdManager * ddS,
  DdManager * ddD,
  DdNode * f)
{
    DdNode *res;
    st__table *table = NULL;
    st__generator *gen = NULL;
    DdNode *key, *value;

    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) goto failure;
    res = cuddBddTransferRecur(ddS, ddD, f, table);
    if (res != NULL) cuddRef(res);

    /* Dereference all elements in the table and dispose of the table.
    ** This must be done also if res is NULL to avoid leaks in case of
    ** reordering. */
    gen = st__init_gen(table);
    if (gen == NULL) goto failure;
    while ( st__gen(gen, (const char **)&key, (char **)&value)) {
        Cudd_RecursiveDeref(ddD, value);
    }
    st__free_gen(gen); gen = NULL;
    st__free_table(table); table = NULL;

    if (res != NULL) cuddDeref(res);
    return(res);

failure:
    /* No need to free gen because it is always NULL here. */
    if (table != NULL) st__free_table(table);
    return(NULL);

}